

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH8Factory::BVH8Triangle4v
          (BVH8Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  bool bVar1;
  BVH8 *bvh;
  Builder *builder;
  AccelInstance *this_00;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Intersectors intersectors;
  
  bvh = (BVH8 *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&TriangleMv<4>::type,scene);
  BVH8Triangle4vIntersectors(&intersectors,this,bvh,ivariant);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"default");
  if (bVar1) {
    if (bvariant == STATIC) {
      builder = (*this->BVH8Triangle4vSceneBuilderSAH)(bvh,scene,0);
    }
    else if (bvariant == DYNAMIC) {
      builder = (*this->BVH8BuilderTwoLevelTriangle4vMeshSAH)(bvh,scene,false);
    }
    else if (bvariant == HIGH_QUALITY) {
      builder = (*this->BVH8Triangle4vSceneBuilderFastSpatialSAH)(bvh,scene,0);
    }
    else {
      builder = (Builder *)0x0;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"sah_fast_spatial")
    ;
    if (!bVar1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+(&bStack_178,"unknown builder ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
      std::operator+(&local_158,&bStack_178," for BVH8<Triangle4v>");
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_158);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    builder = (*this->BVH8Triangle4SceneBuilderFastSpatialSAH)(bvh,scene,0);
  }
  this_00 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_00,(AccelData *)bvh,builder,&intersectors);
  return &this_00->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8Triangle4v(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH8* accel = new BVH8(Triangle4v::type,scene);
    Accel::Intersectors intersectors= BVH8Triangle4vIntersectors(accel,ivariant);
    Builder* builder = nullptr;
    if (scene->device->tri_builder == "default")  {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH8Triangle4vSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH8BuilderTwoLevelTriangle4vMeshSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: builder = BVH8Triangle4vSceneBuilderFastSpatialSAH(accel,scene,0); break;
      }
    }
    else if (scene->device->tri_builder == "sah_fast_spatial")  builder = BVH8Triangle4SceneBuilderFastSpatialSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->tri_builder+" for BVH8<Triangle4v>");
    return new AccelInstance(accel,builder,intersectors);
  }